

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O3

Utest * __thiscall
TEST_MemoryLeakDetectorTest_OneLeak_TestShell::createTest
          (TEST_MemoryLeakDetectorTest_OneLeak_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(0x20,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
                                  ,0x84);
  this_00->_vptr_Utest = (_func_int **)0x0;
  this_00[1]._vptr_Utest = (_func_int **)0x0;
  this_00[2]._vptr_Utest = (_func_int **)0x0;
  this_00[3]._vptr_Utest = (_func_int **)0x0;
  Utest::Utest(this_00);
  this_00->_vptr_Utest = (_func_int **)&PTR__Utest_0035b638;
  return this_00;
}

Assistant:

TEST(MemoryLeakDetectorTest, OneLeak)
{
    char* mem = detector->allocMemory(testAllocator, 3);
    detector->stopChecking();
    SimpleString output = detector->report(mem_leak_period_checking);
    STRCMP_CONTAINS("Memory leak(s) found", output.asCharString());
    STRCMP_CONTAINS("size: 3", output.asCharString());
    STRCMP_CONTAINS("alloc", output.asCharString());
    STRCMP_CONTAINS(StringFromFormat("%p", (void*) mem).asCharString(), output.asCharString());
    STRCMP_CONTAINS("Total number of leaks", output.asCharString());
    PlatformSpecificFree(mem);
    LONGS_EQUAL(1, testAllocator->alloc_called);
    LONGS_EQUAL(0, testAllocator->free_called);
}